

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_check_pub_priv(mbedtls_rsa_context *pub,mbedtls_rsa_context *prv)

{
  int iVar1;
  mbedtls_rsa_context *in_RSI;
  long in_RDI;
  
  iVar1 = mbedtls_rsa_check_pubkey(in_RSI);
  if ((iVar1 != 0) || (iVar1 = mbedtls_rsa_check_privkey(in_RSI), iVar1 != 0)) {
    return -0x4200;
  }
  iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)(in_RDI + 0x10),&in_RSI->N);
  if ((iVar1 == 0) &&
     (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)(in_RDI + 0x20),&in_RSI->E), iVar1 == 0)) {
    return 0;
  }
  return -0x4200;
}

Assistant:

int mbedtls_rsa_check_pub_priv(const mbedtls_rsa_context *pub,
                               const mbedtls_rsa_context *prv)
{
    if (mbedtls_rsa_check_pubkey(pub)  != 0 ||
        mbedtls_rsa_check_privkey(prv) != 0) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    if (mbedtls_mpi_cmp_mpi(&pub->N, &prv->N) != 0 ||
        mbedtls_mpi_cmp_mpi(&pub->E, &prv->E) != 0) {
        return MBEDTLS_ERR_RSA_KEY_CHECK_FAILED;
    }

    return 0;
}